

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_pyramid.h
# Opt level: O2

void gimage::reduceGauss<unsigned_short,unsigned_short>
               (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *target,
               Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image)

{
  ushort uVar1;
  work_t wVar2;
  ushort *puVar3;
  long lVar4;
  float *pfVar5;
  long lVar6;
  unsigned_short *puVar7;
  long lVar8;
  long lVar9;
  long k;
  long lVar10;
  int d;
  long lVar11;
  work_t wVar12;
  float fVar13;
  long local_78;
  ImageFloat tmp;
  
  Image<float,_gimage::PixelTraits<float>_>::Image(&tmp,(image->width + 1) / 2,image->height,1);
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
            (target,(image->width + 1) / 2,(image->height + 1) / 2,(long)image->depth);
  for (lVar11 = 0; lVar11 < image->depth; lVar11 = lVar11 + 1) {
    pfVar5 = **tmp.img;
    for (lVar10 = 0; lVar10 < image->height; lVar10 = lVar10 + 1) {
      lVar6 = -2;
      for (lVar8 = 0; lVar8 < image->width; lVar8 = lVar8 + 2) {
        if (lVar8 == 0 || image->width + -2 <= lVar8) {
          fVar13 = 0.0;
          lVar4 = lVar6;
          for (lVar9 = 0; lVar9 != 0x14; lVar9 = lVar9 + 4) {
            wVar2 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getBounds
                              (image,lVar4,lVar10,(int)lVar11);
            fVar13 = fVar13 + (float)wVar2 *
                              *(float *)((long)reduceGauss<unsigned_short,_unsigned_short>::g +
                                        lVar9);
            lVar4 = lVar4 + 1;
          }
        }
        else {
          puVar3 = image->img[lVar11][lVar10] + lVar8 + -2;
          fVar13 = 0.0;
          for (lVar4 = 0; lVar4 != 0x14; lVar4 = lVar4 + 4) {
            uVar1 = *puVar3;
            puVar3 = puVar3 + 1;
            fVar13 = fVar13 + (float)uVar1 *
                              *(float *)((long)reduceGauss<unsigned_short,_unsigned_short>::g +
                                        lVar4);
          }
        }
        *pfVar5 = fVar13;
        pfVar5 = pfVar5 + 1;
        lVar6 = lVar6 + 2;
      }
    }
    local_78 = 0;
    for (lVar10 = 0; lVar10 < tmp.width; lVar10 = lVar10 + 1) {
      puVar7 = *target->img[lVar11] + lVar10;
      lVar6 = -2;
      for (lVar8 = 0; lVar8 < tmp.height; lVar8 = lVar8 + 2) {
        if (lVar8 == 0 || tmp.height + -2 <= lVar8) {
          fVar13 = 0.0;
          lVar4 = lVar6;
          for (lVar9 = 0; lVar9 != 0x14; lVar9 = lVar9 + 4) {
            wVar12 = Image<float,_gimage::PixelTraits<float>_>::getBounds(&tmp,lVar10,lVar4,0);
            fVar13 = fVar13 + wVar12 * *(float *)((long)reduceGauss<unsigned_short,_unsigned_short>
                                                        ::g + lVar9);
            lVar4 = lVar4 + 1;
          }
        }
        else {
          pfVar5 = (float *)((long)(*tmp.img)[lVar8 + -2] + local_78);
          fVar13 = 0.0;
          for (lVar4 = 0; lVar4 != 0x14; lVar4 = lVar4 + 4) {
            fVar13 = fVar13 + *(float *)((long)reduceGauss<unsigned_short,_unsigned_short>::g +
                                        lVar4) * *pfVar5;
            pfVar5 = pfVar5 + tmp.width;
          }
        }
        *puVar7 = (unsigned_short)(int)fVar13;
        puVar7 = puVar7 + target->width;
        lVar6 = lVar6 + 2;
      }
      local_78 = local_78 + 4;
    }
  }
  Image<float,_gimage::PixelTraits<float>_>::~Image(&tmp);
  return;
}

Assistant:

void reduceGauss(Image<T> &target, const Image<S> &image)
{
  static const float g[]={0.0625, 0.25, 0.375, 0.25, 0.0625};

  // intermediate image with downscaled width

  ImageFloat tmp((image.getWidth()+1)/2, image.getHeight(), 1);

  // downscaled target image

  target.setSize((image.getWidth()+1)/2, (image.getHeight()+1)/2, image.getDepth());

  // for all color channels

  for (int d=0; d<image.getDepth(); d++)
  {
    // convolve horizontal into horizontally downscaled intermediate image

    float *tmpp=tmp.getPtr(0, 0, 0);
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i+=2)
      {
        float pv=0;

        if (i >= 2 && i < image.getWidth()-2)
        {
          S *p=image.getPtr(i-2, k, d);
          for (long j=0; j<5; j++)
          {
            pv+=g[j]* *p++;
          }
        }
        else
        {
          for (long j=0; j<5; j++)
          {
            pv+=g[j]*image.getBounds(i+j-2, k, d);
          }
        }

        *tmpp++=pv;
      }
    }

    // convolve vertically into downscaled target image

    for (long i=0; i<tmp.getWidth(); i++)
    {
      T *tp=target.getPtr(i, 0, d);
      for (long k=0; k<tmp.getHeight(); k+=2)
      {
        float pv=0;

        if (k >= 2 && k < tmp.getHeight()-2)
        {
          float *p=tmp.getPtr(i, k-2, 0);
          for (long j=0; j<5; j++)
          {
            pv+=g[j]* *p;
            p+=tmp.getWidth();
          }
        }
        else
        {
          for (long j=0; j<5; j++)
          {
            pv+=g[j]*tmp.getBounds(i, k+j-2, 0);
          }
        }

        *tp=static_cast<T>(pv);
        tp+=target.getWidth();
      }
    }
  }
}